

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser * init_parse_slay(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"code str code",parse_slay_code);
  parser_reg(p_00,"name str name",parse_slay_name);
  parser_reg(p_00,"race-flag sym flag",parse_slay_race_flag);
  parser_reg(p_00,"base sym base",parse_slay_base);
  parser_reg(p_00,"multiplier uint multiplier",parse_slay_multiplier);
  parser_reg(p_00,"o-multiplier uint multiplier",parse_slay_o_multiplier);
  parser_reg(p_00,"power uint power",parse_slay_power);
  parser_reg(p_00,"melee-verb str verb",parse_slay_melee_verb);
  parser_reg(p_00,"range-verb str verb",parse_slay_range_verb);
  return p_00;
}

Assistant:

static struct parser *init_parse_slay(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "code str code", parse_slay_code);
	parser_reg(p, "name str name", parse_slay_name);
	parser_reg(p, "race-flag sym flag", parse_slay_race_flag);
	parser_reg(p, "base sym base", parse_slay_base);
	parser_reg(p, "multiplier uint multiplier", parse_slay_multiplier);
	parser_reg(p, "o-multiplier uint multiplier", parse_slay_o_multiplier);
	parser_reg(p, "power uint power", parse_slay_power);
	parser_reg(p, "melee-verb str verb", parse_slay_melee_verb);
	parser_reg(p, "range-verb str verb", parse_slay_range_verb);
	return p;
}